

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_cdef(AV1_COMMON *cm,MACROBLOCKD *xd,aom_writer *w,int skip)

{
  uint uVar1;
  uint uVar2;
  SequenceHeader *pSVar3;
  ulong uVar4;
  
  if (((cm->features).coded_lossless == false) && ((cm->features).allow_intrabc == false)) {
    pSVar3 = cm->seq_params;
    uVar1 = xd->mi_row;
    uVar2 = xd->mi_col;
    if ((pSVar3->mib_size - 1U & (uVar2 | uVar1)) == 0) {
      xd->cdef_transmitted[0] = false;
      xd->cdef_transmitted[1] = false;
      xd->cdef_transmitted[2] = false;
      xd->cdef_transmitted[3] = false;
    }
    uVar4 = 0;
    if (pSVar3->sb_size == BLOCK_128X128) {
      uVar4 = (ulong)(uVar1 >> 3 & 2 | uVar2 >> 4 & 1);
    }
    if ((skip == 0) && (xd->cdef_transmitted[uVar4] == false)) {
      aom_write_literal(w,(int)(short)(*(short *)&(cm->mi_params).mi_grid_base
                                                  [(int)((uVar1 & 0xfffffff0) *
                                                         (cm->mi_params).mi_stride +
                                                        (uVar2 & 0xfffffff0))]->field_0xa7 * 2) >>
                          0xc,(cm->cdef_info).cdef_bits);
      xd->cdef_transmitted[uVar4] = true;
    }
  }
  return;
}

Assistant:

static inline void write_cdef(AV1_COMMON *cm, MACROBLOCKD *const xd,
                              aom_writer *w, int skip) {
  if (cm->features.coded_lossless || cm->features.allow_intrabc) return;

  // At the start of a superblock, mark that we haven't yet written CDEF
  // strengths for any of the CDEF units contained in this superblock.
  const int sb_mask = (cm->seq_params->mib_size - 1);
  const int mi_row_in_sb = (xd->mi_row & sb_mask);
  const int mi_col_in_sb = (xd->mi_col & sb_mask);
  if (mi_row_in_sb == 0 && mi_col_in_sb == 0) {
    xd->cdef_transmitted[0] = xd->cdef_transmitted[1] =
        xd->cdef_transmitted[2] = xd->cdef_transmitted[3] = false;
  }

  // CDEF unit size is 64x64 irrespective of the superblock size.
  const int cdef_size = 1 << (6 - MI_SIZE_LOG2);

  // Find index of this CDEF unit in this superblock.
  const int index_mask = cdef_size;
  const int cdef_unit_row_in_sb = ((xd->mi_row & index_mask) != 0);
  const int cdef_unit_col_in_sb = ((xd->mi_col & index_mask) != 0);
  const int index = (cm->seq_params->sb_size == BLOCK_128X128)
                        ? cdef_unit_col_in_sb + 2 * cdef_unit_row_in_sb
                        : 0;

  // Write CDEF strength to the first non-skip coding block in this CDEF unit.
  if (!xd->cdef_transmitted[index] && !skip) {
    // CDEF strength for this CDEF unit needs to be stored in the MB_MODE_INFO
    // of the 1st block in this CDEF unit.
    const int first_block_mask = ~(cdef_size - 1);
    const CommonModeInfoParams *const mi_params = &cm->mi_params;
    const int grid_idx =
        get_mi_grid_idx(mi_params, xd->mi_row & first_block_mask,
                        xd->mi_col & first_block_mask);
    const MB_MODE_INFO *const mbmi = mi_params->mi_grid_base[grid_idx];
    aom_write_literal(w, mbmi->cdef_strength, cm->cdef_info.cdef_bits);
    xd->cdef_transmitted[index] = true;
  }
}